

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

string * el::base::utils::Str::rtrim(string *str)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  uVar4 = str->_M_string_length;
  pcVar6 = pcVar1 + uVar4;
  lVar3 = (long)uVar4 >> 2;
  pcVar7 = pcVar6;
  if (0 < lVar3) {
    pcVar7 = pcVar6 + -(uVar4 & 0xfffffffffffffffc);
    pcVar6 = pcVar6 + lVar3 * -4;
    lVar3 = lVar3 + 1;
    do {
      iVar2 = isspace((int)pcVar1[uVar4 - 1]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + uVar4;
        goto LAB_0010fdfe;
      }
      iVar2 = isspace((int)pcVar1[uVar4 - 2]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + (uVar4 - 1);
        goto LAB_0010fdfe;
      }
      iVar2 = isspace((int)pcVar1[uVar4 - 3]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + (uVar4 - 2);
        goto LAB_0010fdfe;
      }
      iVar2 = isspace((int)pcVar1[uVar4 - 4]);
      if (iVar2 == 0) {
        pcVar5 = pcVar1 + (uVar4 - 3);
        goto LAB_0010fdfe;
      }
      uVar4 = uVar4 - 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pcVar7 - (long)pcVar1;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      pcVar5 = pcVar1;
      if ((lVar3 != 3) || (iVar2 = isspace((int)pcVar7[-1]), pcVar5 = pcVar7, iVar2 == 0))
      goto LAB_0010fdfe;
      pcVar7 = pcVar6 + -1;
      pcVar6 = pcVar7;
    }
    iVar2 = isspace((int)pcVar7[-1]);
    pcVar5 = pcVar7;
    if (iVar2 == 0) goto LAB_0010fdfe;
    pcVar7 = pcVar6 + -1;
  }
  iVar2 = isspace((int)pcVar7[-1]);
  pcVar5 = pcVar7;
  if (iVar2 != 0) {
    pcVar5 = pcVar1;
  }
LAB_0010fdfe:
  str->_M_string_length = (long)pcVar5 - (long)pcVar1;
  *pcVar5 = '\0';
  return str;
}

Assistant:

std::string& Str::rtrim(std::string& str) {
  str.erase(std::find_if(str.rbegin(), str.rend(), [](char c) {
    return !std::isspace(c);
  }).base(), str.end());
  return str;
}